

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ta_frame.c
# Opt level: O0

TA_RetCode
TA_MACDEXT_FramePP(TA_ParamHolderPriv *params,int startIdx,int endIdx,int *outBegIdx,
                  int *outNBElement)

{
  TA_RetCode TVar1;
  undefined8 in_RCX;
  TA_MAType in_EDX;
  undefined8 unaff_RBX;
  int unaff_EBP;
  int in_ESI;
  double *in_RDI;
  int unaff_R12D;
  TA_MAType unaff_R15D;
  TA_MAType unaff_retaddr;
  int *in_stack_00000008;
  int *in_stack_00000010;
  double *in_stack_00000018;
  double *in_stack_00000020;
  double *in_stack_00000028;
  
  TVar1 = TA_MACDEXT(unaff_R12D,(int)((ulong)unaff_RBX >> 0x20),in_RDI,in_ESI,in_EDX,
                     (int)((ulong)in_RCX >> 0x20),unaff_R15D,unaff_EBP,unaff_retaddr,
                     in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020,
                     in_stack_00000028);
  return TVar1;
}

Assistant:

TA_RetCode TA_MACDEXT_FramePP( const TA_ParamHolderPriv *params,
/* Generated */                           int            startIdx,
/* Generated */                           int            endIdx,
/* Generated */                           int           *outBegIdx,
/* Generated */                           int           *outNBElement )
/* Generated */ {
/* Generated */    return TA_MACDEXT(
/* Generated */                 startIdx,
/* Generated */                 endIdx,
/* Generated */                 params->in[0].data.inReal, /* inReal */
/* Generated */                 params->optIn[0].data.optInInteger, /* optInFastPeriod*/
/* Generated */                 (TA_MAType)params->optIn[1].data.optInInteger, /* optInFastMAType*/
/* Generated */                 params->optIn[2].data.optInInteger, /* optInSlowPeriod*/
/* Generated */                 (TA_MAType)params->optIn[3].data.optInInteger, /* optInSlowMAType*/
/* Generated */                 params->optIn[4].data.optInInteger, /* optInSignalPeriod*/
/* Generated */                 (TA_MAType)params->optIn[5].data.optInInteger, /* optInSignalMAType*/
/* Generated */                 outBegIdx, 
/* Generated */                 outNBElement, 
/* Generated */                 params->out[0].data.outReal, /*  outMACD */
/* Generated */                 params->out[1].data.outReal, /*  outMACDSignal */
/* Generated */                 params->out[2].data.outReal /*  outMACDHist */ );
/* Generated */ }